

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O3

void rfc5444_writer_unregister_content_provider
               (rfc5444_writer *writer,rfc5444_writer_content_provider *cpr,
               rfc5444_writer_tlvtype *addrtlvs,size_t addrtlvs_count)

{
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x175,
                  "void rfc5444_writer_unregister_content_provider(struct rfc5444_writer *, struct rfc5444_writer_content_provider *, struct rfc5444_writer_tlvtype *, size_t)"
                 );
  }
  if (((cpr->_provider_node).list.next != (list_entity *)0x0) &&
     ((cpr->_provider_node).list.prev != (list_entity *)0x0)) {
    if (addrtlvs_count != 0) {
      do {
        rfc5444_writer_unregister_addrtlvtype(writer,addrtlvs);
        addrtlvs = addrtlvs + 1;
        addrtlvs_count = addrtlvs_count - 1;
      } while (addrtlvs_count != 0);
    }
    avl_remove(&cpr->creator->_provider_tree,&cpr->_provider_node);
    _lazy_free_message(writer,cpr->creator);
    return;
  }
  return;
}

Assistant:

void
rfc5444_writer_unregister_content_provider(struct rfc5444_writer *writer, struct rfc5444_writer_content_provider *cpr,
  struct rfc5444_writer_tlvtype *addrtlvs, size_t addrtlvs_count) {
  size_t i;
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  if (!avl_is_node_added(&cpr->_provider_node)) {
    return;
  }

  for (i = 0; i < addrtlvs_count; i++) {
    rfc5444_writer_unregister_addrtlvtype(writer, &addrtlvs[i]);
  }
  avl_remove(&cpr->creator->_provider_tree, &cpr->_provider_node);
  _lazy_free_message(writer, cpr->creator);
}